

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output_simple
               (xml_buffered_writer *writer,xml_node_struct *node,uint flags)

{
  uint *__n;
  size_t sVar1;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *__buf_01;
  char *local_80;
  char *local_70;
  char *local_60;
  char *local_50;
  char *local_40;
  char_t *default_name;
  uint flags_local;
  xml_node_struct *node_local;
  xml_buffered_writer *writer_local;
  
  __n = &switchD_00288dae::switchdataD_002dd460;
  switch((uint)node->header & 0xf) {
  case 3:
    if (node->value == (char_t *)0x0) {
      local_40 = "";
    }
    else {
      local_40 = node->value;
    }
    text_output(writer,local_40,ctx_special_pcdata,flags);
    break;
  case 4:
    if (node->value == (char_t *)0x0) {
      local_50 = "";
    }
    else {
      local_50 = node->value;
    }
    text_output_cdata(writer,local_50);
    break;
  case 5:
    if (node->value == (char_t *)0x0) {
      local_60 = "";
    }
    else {
      local_60 = node->value;
    }
    node_output_comment(writer,local_60);
    break;
  case 6:
    xml_buffered_writer::write(writer,0x3c,(void *)0x3f,0x2dd460);
    if (node->name == (char_t *)0x0) {
      local_70 = ":anonymous";
    }
    else {
      local_70 = node->name;
    }
    xml_buffered_writer::write_string(writer,local_70);
    if (node->value != (char_t *)0x0) {
      xml_buffered_writer::write(writer,0x20,__buf,(size_t)__n);
      node_output_pi_value(writer,node->value);
    }
    xml_buffered_writer::write(writer,0x3f,(void *)0x3e,(size_t)__n);
    break;
  case 7:
    xml_buffered_writer::write(writer,0x3c,(void *)0x3f,0x2dd460);
    if (node->name == (char_t *)0x0) {
      local_80 = ":anonymous";
    }
    else {
      local_80 = node->name;
    }
    xml_buffered_writer::write_string(writer,local_80);
    sVar1 = 0;
    node_output_attributes(writer,node,"",0,flags | 4,0);
    xml_buffered_writer::write(writer,0x3f,(void *)0x3e,sVar1);
    break;
  case 8:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x44);
    sVar1 = 0x50;
    xml_buffered_writer::write(writer,0x54,(void *)0x59,0x50);
    __buf_01 = __buf_00;
    if (node->value != (char_t *)0x0) {
      xml_buffered_writer::write(writer,0x20,__buf_00,sVar1);
      xml_buffered_writer::write_string(writer,node->value);
      __buf_01 = extraout_RDX;
    }
    xml_buffered_writer::write(writer,0x3e,__buf_01,sVar1);
    break;
  default:
    __assert_fail("false && \"Invalid node type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x10b9,
                  "void pugi::impl::(anonymous namespace)::node_output_simple(xml_buffered_writer &, xml_node_struct *, unsigned int)"
                 );
  }
  return;
}

Assistant:

PUGI_IMPL_FN void node_output_simple(xml_buffered_writer& writer, xml_node_struct* node, unsigned int flags)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");

		switch (PUGI_IMPL_NODETYPE(node))
		{
			case node_pcdata:
				text_output(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""), ctx_special_pcdata, flags);
				break;

			case node_cdata:
				text_output_cdata(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_comment:
				node_output_comment(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_pi:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);

				if (node->value)
				{
					writer.write(' ');
					node_output_pi_value(writer, node->value);
				}

				writer.write('?', '>');
				break;

			case node_declaration:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);
				node_output_attributes(writer, node, PUGIXML_TEXT(""), 0, flags | format_raw, 0);
				writer.write('?', '>');
				break;

			case node_doctype:
				writer.write('<', '!', 'D', 'O', 'C');
				writer.write('T', 'Y', 'P', 'E');

				if (node->value)
				{
					writer.write(' ');
					writer.write_string(node->value);
				}

				writer.write('>');
				break;

			default:
				assert(false && "Invalid node type"); // unreachable
		}
	}